

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O3

void __thiscall
polyscope::render::backend_openGL_mock::GLTextureBuffer::setData
          (GLTextureBuffer *this,
          vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
          *data)

{
  string local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"not implemented","");
  exception(&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

int GLAttributeBuffer::getData_int(size_t ind) {
  if (getType() != RenderDataType::Int) exception("bad getData type");
  return getData_helper<int>(ind);
}